

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressLiterals
                 (ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,ZSTD_strategy strategy,
                 int disableLiteralCompression,void *dst,size_t dstCapacity,void *src,size_t srcSize
                 ,void *entropyWorkspace,size_t entropyWorkspaceSize,int bmi2)

{
  ulong dstCapacity_00;
  size_t sVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  HUF_repeat repeat;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  ulong local_40;
  size_t local_38;
  
  local_60 = dstCapacity;
  if (strategy + ~ZSTD_btultra2 < 0xfffffff7) {
    __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, strat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2012,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
  }
  local_40 = (ulong)(uint)bmi2;
  local_38 = entropyWorkspaceSize;
  bVar2 = 6;
  if (7 < (int)strategy) {
    bVar2 = (char)strategy - 1;
  }
  uVar5 = srcSize >> (bVar2 & 0x3f);
  local_48 = entropyWorkspace;
  memcpy(nextHuf,prevHuf,0x404);
  dstCapacity_00 = local_60;
  if (disableLiteralCompression == 0) {
    uVar6 = 0x3f;
    if (prevHuf->repeatMode == HUF_repeat_valid) {
      uVar6 = 6;
    }
    local_58 = (ulong)strategy;
    local_50 = uVar5;
    if (uVar6 < srcSize) {
      uVar5 = ((ulong)(0x3ff < srcSize) - (ulong)(srcSize < 0x4000)) + 4;
      sVar1 = 0xffffffffffffffba;
      if (uVar5 <= local_60 && local_60 - uVar5 != 0) {
        repeat = prevHuf->repeatMode;
        bVar8 = repeat != HUF_repeat_valid;
        sVar1 = HUF_compress_internal
                          ((void *)((long)dst + uVar5),local_60 - uVar5,src,srcSize,0xff,0xb,
                           (uint)((uVar5 != 3 || bVar8) && 0xff < srcSize),local_48,local_38,
                           (HUF_CElt *)nextHuf,&repeat,(uint)(srcSize < 0x401 && (int)strategy < 4),
                           (int)local_40);
        uVar3 = 3 - (repeat == HUF_repeat_none);
        if (sVar1 < (srcSize - local_50) - 2 && sVar1 - 1 < 0xffffffffffffff88) {
          if (sVar1 == 1) {
            memcpy(nextHuf,prevHuf,0x404);
            sVar1 = ZSTD_compressRleLiteralsBlock(dst,(size_t)prevHuf,src,srcSize);
          }
          else {
            if (repeat == HUF_repeat_none) {
              nextHuf->repeatMode = HUF_repeat_check;
            }
            iVar7 = (int)srcSize;
            iVar4 = (int)sVar1;
            if (uVar5 == 5) {
              *(uint *)dst = iVar4 * 0x400000 + iVar7 * 0x10 | uVar3 | 0xc;
              *(char *)((long)dst + 4) = (char)(sVar1 >> 10);
            }
            else if (uVar5 == 4) {
              *(uint *)dst = iVar4 * 0x40000 + iVar7 * 0x10 | uVar3 | 8;
            }
            else {
              iVar4 = iVar4 * 0x4000 +
                      ((uVar3 | iVar7 * 0x10 + (uint)(uVar5 == 3 && !bVar8 || 0xff >= srcSize) * 4)
                      ^ 4);
              *(short *)dst = (short)iVar4;
              *(char *)((long)dst + 2) = (char)((uint)iVar4 >> 0x10);
            }
            sVar1 = sVar1 + uVar5;
          }
        }
        else {
          memcpy(nextHuf,prevHuf,0x404);
          sVar1 = ZSTD_noCompressLiterals(dst,dstCapacity_00,src,srcSize);
        }
      }
    }
    else {
      sVar1 = ZSTD_noCompressLiterals(dst,local_60,src,srcSize);
    }
    return sVar1;
  }
  sVar1 = ZSTD_noCompressLiterals(dst,local_60,src,srcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_compressLiterals (ZSTD_hufCTables_t const* prevHuf,
                              ZSTD_hufCTables_t* nextHuf,
                              ZSTD_strategy strategy, int disableLiteralCompression,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                              void* entropyWorkspace, size_t entropyWorkspaceSize,
                        const int bmi2)
{
    size_t const minGain = ZSTD_minGain(srcSize, strategy);
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i)",
                disableLiteralCompression);

    /* Prepare nextEntropy assuming reusing the existing table */
    memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* small ? don't even attempt compression (speed opt) */
#   define COMPRESS_LITERALS_SIZE_MIN 63
    {   size_t const minLitSize = (prevHuf->repeatMode == HUF_repeat_valid) ? 6 : COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const preferRepeat = strategy < ZSTD_lazy ? srcSize <= 1024 : 0;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        cLitSize = singleStream ?
            HUF_compress1X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2) :
            HUF_compress4X_repeat(
                ostart+lhSize, dstCapacity-lhSize, src, srcSize,
                HUF_SYMBOLVALUE_MAX, HUF_TABLELOG_DEFAULT, entropyWorkspace, entropyWorkspaceSize,
                (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            hType = set_repeat;
        }
    }

    if ((cLitSize==0) | (cLitSize >= srcSize - minGain) | ERR_isError(cLitSize)) {
        memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }
    if (cLitSize==1) {
        memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    return lhSize+cLitSize;
}